

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O3

void __thiscall CubicLattice::createFaces(CubicLattice *this)

{
  int iVar1;
  double dVar2;
  Lattice *this_00;
  int iVar3;
  int vertexIndex;
  long *plVar4;
  long lVar5;
  cartesian4 cVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  allocator_type local_11e;
  allocator_type local_11d;
  int local_11c;
  vector<int,_std::allocator<int>_> local_118;
  undefined1 **local_100;
  undefined1 **local_f8;
  Lattice *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  int local_68 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  double local_38;
  
  dVar2 = pow((double)(this->super_Lattice).l,3.0);
  if (0.0 < dVar2) {
    local_100 = local_c8;
    local_11c = 0;
    vertexIndex = 0;
    local_f8 = local_100;
    local_f0 = &this->super_Lattice;
    do {
      cVar6 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
      iVar3 = (this->super_Lattice).l;
      iVar1 = iVar3 + -1;
      if (iVar1 != cVar6.z) {
        if (iVar1 != cVar6.y && iVar1 != cVar6.x) {
          if (cVar6.z < iVar3 + -2) {
            if (cVar6.x != 0) {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"y","");
              local_c8[0] = local_b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"z","");
              local_a8[0] = local_98;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"z","");
              local_88[0] = local_78;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"y","");
              __l._M_len = 4;
              __l._M_array = &local_e8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_50,__l,&local_11d);
              local_68[0] = 1;
              local_68[1] = 1;
              local_68[2] = 1;
              local_68[3] = 1;
              __l_00._M_len = 4;
              __l_00._M_array = local_68;
              std::vector<int,_std::allocator<int>_>::vector(&local_118,__l_00,&local_11e);
              Lattice::addFace(&this->super_Lattice,vertexIndex,local_11c,&local_50,&local_118);
              if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_118.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_50);
              lVar5 = -0x80;
              plVar4 = local_78;
              do {
                if (plVar4 != (long *)plVar4[-2]) {
                  operator_delete((long *)plVar4[-2],*plVar4 + 1);
                }
                plVar4 = plVar4 + -4;
                lVar5 = lVar5 + 0x20;
              } while (lVar5 != 0);
              local_11c = local_11c + 1;
              this = (CubicLattice *)local_f0;
            }
            if (cVar6._0_8_ >> 0x20 != 0) {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x","");
              local_c8[0] = local_b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"z","");
              local_a8[0] = local_98;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"z","");
              local_88[0] = local_78;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"x","");
              __l_01._M_len = 4;
              __l_01._M_array = &local_e8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_50,__l_01,&local_11d);
              local_68[0] = 1;
              local_68[1] = 1;
              local_68[2] = 1;
              local_68[3] = 1;
              __l_02._M_len = 4;
              __l_02._M_array = local_68;
              std::vector<int,_std::allocator<int>_>::vector(&local_118,__l_02,&local_11e);
              Lattice::addFace(&this->super_Lattice,vertexIndex,local_11c,&local_50,&local_118);
              if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_118.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_50);
              lVar5 = -0x80;
              plVar4 = local_78;
              do {
                if (plVar4 != (long *)plVar4[-2]) {
                  operator_delete((long *)plVar4[-2],*plVar4 + 1);
                }
                plVar4 = plVar4 + -4;
                lVar5 = lVar5 + 0x20;
              } while (lVar5 != 0);
              local_11c = local_11c + 1;
            }
          }
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x","");
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"y","");
          local_a8[0] = local_98;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"y","");
          local_88[0] = local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"x","");
          __l_03._M_len = 4;
          __l_03._M_array = &local_e8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_50,__l_03,&local_11d);
          this_00 = local_f0;
          local_68[0] = 1;
          local_68[1] = 1;
          local_68[2] = 1;
          local_68[3] = 1;
          __l_04._M_len = 4;
          __l_04._M_array = local_68;
          std::vector<int,_std::allocator<int>_>::vector(&local_118,__l_04,&local_11e);
          Lattice::addFace(this_00,vertexIndex,local_11c,&local_50,&local_118);
          if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_50);
          lVar5 = -0x80;
          plVar4 = local_78;
          do {
            if (plVar4 != (long *)plVar4[-2]) {
              operator_delete((long *)plVar4[-2],*plVar4 + 1);
            }
            plVar4 = plVar4 + -4;
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0);
          local_11c = local_11c + 1;
          iVar3 = local_f0->l;
          this = (CubicLattice *)local_f0;
        }
      }
      vertexIndex = vertexIndex + 1;
      local_38 = (double)vertexIndex;
      dVar2 = pow((double)iVar3,3.0);
    } while (local_38 < dVar2);
  }
  return;
}

Assistant:

void CubicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.z == l - 1 || coordinate.x == l - 1 || coordinate.y == l - 1)
        {
            continue;
        }
        if (coordinate.z < l - 2)
        {
            if (!(coordinate.x == 0))
            {
                // Add yz face
                addFace(vertexIndex, faceIndex, {"y", "z", "z", "y"}, {1, 1, 1, 1});
                ++faceIndex;
            }
            if (!(coordinate.y == 0))
            {
                // Add xz face
                addFace(vertexIndex, faceIndex, {"x", "z", "z", "x"}, {1, 1, 1, 1});
                ++faceIndex;
            }
        }
        // Add xy face
        addFace(vertexIndex, faceIndex, {"x", "y", "y", "x"}, {1, 1, 1, 1});
        ++faceIndex;
    }
}